

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteMap<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Field<google::protobuf::json_internal::UnparseProto3Type> field)

{
  Desc *d;
  JsonWriter *this_00;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_3
  aVar1;
  Field pFVar2;
  size_t idx;
  string_view ws;
  bool first;
  JsonWriter *local_128;
  StatusOr<long> x;
  StatusOr<bool> is_empty;
  StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> entry;
  _Tuple_impl<0UL,_unsigned_int> local_d0;
  _Tuple_impl<0UL,_int> local_cc;
  string *local_c8;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *local_c0;
  Field<google::protobuf::json_internal::UnparseProto3Type> local_b8;
  size_t local_b0;
  _Tuple_impl<0UL,_const_char_*> local_a8;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_a0;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_98;
  undefined1 local_90 [32];
  Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> local_70;
  AlphaNum local_60;
  
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
  writer->indent_ = writer->indent_ + 1;
  local_c0 = msg;
  local_b8 = field;
  local_b0 = UnparseProto3Type::GetSize(field,msg);
  first = true;
  local_c8 = &writer->scratch_buf_;
  idx = 0;
  local_128 = writer;
  while( true ) {
    this_00 = local_128;
    if (local_b0 == idx) {
      local_128->indent_ = local_128->indent_ + -1;
      if (first == false) {
        JsonWriter::NewLine(local_128);
      }
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&this_00->sink_,"}",1);
      *(undefined8 *)this = 1;
      return (Status)(uintptr_t)this;
    }
    UnparseProto3Type::GetMessage
              ((UnparseProto3Type *)
               &entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>,
               local_b8,local_c0,idx);
    absl::lts_20240722::Status::Status
              ((Status *)this,
               (Status *)
               &entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>);
    if (*(long *)this != 1) goto LAB_0029f1a2;
    absl::lts_20240722::Status::~Status((Status *)this);
    absl::lts_20240722::internal_statusor::
    StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::EnsureOk
              (&entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>);
    d = (entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.field_1.
        data_)->desc_;
    absl::lts_20240722::internal_statusor::
    StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::EnsureOk
              (&entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>);
    aVar1 = entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.
            field_1;
    pFVar2 = Proto3Type::ValueField(d);
    IsEmptyValue<google::protobuf::json_internal::UnparseProto3Type>
              ((anon_unknown_4 *)&is_empty,aVar1.data_,pFVar2);
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&is_empty);
    if (*(long *)this != 1) break;
    absl::lts_20240722::Status::~Status((Status *)this);
    absl::lts_20240722::internal_statusor::StatusOrData<bool>::EnsureOk
              (&is_empty.super_StatusOrData<bool>);
    if (is_empty.super_StatusOrData<bool>.field_1.data_ != true) {
      JsonWriter::WriteComma(local_128,&first);
      JsonWriter::NewLine(local_128);
      absl::lts_20240722::internal_statusor::
      StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::EnsureOk
                (&entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>)
      ;
      aVar1 = entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.
              field_1;
      pFVar2 = Proto3Type::KeyField(d);
      switch((pFVar2->raw_->field_0)._impl_.kind_) {
      case 3:
      case 0x10:
      case 0x12:
        UnparseProto3Type::GetInt64((UnparseProto3Type *)&x,pFVar2,aVar1.data_,0);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this != 1) {
LAB_0029f092:
          absl::lts_20240722::Status::~Status((Status *)&x);
          goto LAB_0029f09c;
        }
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                  (&x.super_StatusOrData<long>);
        local_98 = x.super_StatusOrData<long>.field_1;
        JsonWriter::Write<long>(local_128,(Quoted<long> *)&local_98);
        break;
      case 4:
      case 6:
        UnparseProto3Type::GetUInt64((UnparseProto3Type *)&x,pFVar2,aVar1.data_,0);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this != 1) goto LAB_0029f092;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::EnsureOk
                  ((StatusOrData<unsigned_long> *)&x);
        local_a0 = x.super_StatusOrData<long>.field_1;
        JsonWriter::Write<unsigned_long>(local_128,(Quoted<unsigned_long> *)&local_a0);
        break;
      case 5:
      case 0xf:
      case 0x11:
        UnparseProto3Type::GetInt32((UnparseProto3Type *)&x,pFVar2,aVar1.data_,0);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this != 1) goto LAB_0029f092;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk((StatusOrData<int> *)&x);
        local_cc.super__Head_base<0UL,_int,_false>._M_head_impl =
             (_Head_base<0UL,_int,_false>)
             (_Head_base<0UL,_int,_false>)x.super_StatusOrData<long>.field_1.data_._0_4_;
        JsonWriter::Write<int>(local_128,(Quoted<int> *)&local_cc);
        break;
      case 7:
      case 0xd:
        UnparseProto3Type::GetUInt32((UnparseProto3Type *)&x,pFVar2,aVar1.data_,0);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this != 1) goto LAB_0029f092;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::EnsureOk
                  ((StatusOrData<unsigned_int> *)&x);
        local_d0.super__Head_base<0UL,_unsigned_int,_false>._M_head_impl =
             (_Head_base<0UL,_unsigned_int,_false>)
             (_Head_base<0UL,_unsigned_int,_false>)x.super_StatusOrData<long>.field_1.data_._0_4_;
        JsonWriter::Write<unsigned_int>(local_128,(Quoted<unsigned_int> *)&local_d0);
        break;
      case 8:
        UnparseProto3Type::GetBool((UnparseProto3Type *)&x,pFVar2,aVar1.data_,0);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this != 1) goto LAB_0029f092;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::EnsureOk
                  ((StatusOrData<bool> *)&x);
        local_a8.super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
             (_Head_base<0UL,_const_char_*,_false>)"false";
        if (x.super_StatusOrData<long>.field_1.data_._0_1_ != '\0') {
          local_a8.super__Head_base<0UL,_const_char_*,_false>._M_head_impl =
               (_Head_base<0UL,_const_char_*,_false>)"true";
        }
        JsonWriter::Write<char_const*>(local_128,(Quoted<const_char_*> *)&local_a8);
        break;
      case 9:
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&x,pFVar2,
                   local_c8,aVar1.data_,0);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this != 1) goto LAB_0029f092;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)&x);
        local_70.value.
        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
        _M_head_impl._M_len = (size_t)x.super_StatusOrData<long>.field_1;
        JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>(local_128,&local_70);
        break;
      default:
        x.super_StatusOrData<long> =
             (StatusOrData<long>)
             absl::lts_20240722::NullSafeStringView("unsupported map key type: ");
        absl::lts_20240722::AlphaNum::AlphaNum(&local_60,(pFVar2->raw_->field_0)._impl_.kind_);
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_90,(AlphaNum *)&x);
        absl::lts_20240722::InvalidArgumentError(this,local_90._8_8_,local_90._0_8_);
        std::__cxx11::string::~string((string *)local_90);
LAB_0029f09c:
        if (*(long *)this != 1) goto LAB_0029f198;
        goto LAB_0029f0a6;
      case 0xe:
        UnparseProto3Type::GetEnumValue((UnparseProto3Type *)&x,pFVar2,aVar1.data_,0);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&x);
        if (*(long *)this != 1) goto LAB_0029f092;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk((StatusOrData<int> *)&x);
        WriteEnum<google::protobuf::json_internal::UnparseProto3Type>
                  (local_128,pFVar2,x.super_StatusOrData<long>.field_1.data_._0_4_,kQuoted);
      }
      absl::lts_20240722::Status::~Status((Status *)&x);
      *(undefined8 *)this = 1;
LAB_0029f0a6:
      absl::lts_20240722::Status::~Status((Status *)this);
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&local_128->sink_,":",1);
      ws._M_str = " ";
      ws._M_len = 1;
      JsonWriter::Whitespace(local_128,ws);
      pFVar2 = Proto3Type::ValueField(d);
      absl::lts_20240722::internal_statusor::
      StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::EnsureOk
                (&entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>)
      ;
      (anonymous_namespace)::
      WriteSingular<google::protobuf::json_internal::UnparseProto3Type,google::protobuf::json_internal::UntypedMessage_const&>
                ((_anonymous_namespace_ *)this,local_128,pFVar2,
                 entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.
                 field_1.data_);
      if (*(long *)this != 1) break;
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    absl::lts_20240722::Status::~Status((Status *)&is_empty);
    absl::lts_20240722::Status::~Status
              ((Status *)
               &entry.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>);
    idx = idx + 1;
  }
LAB_0029f198:
  absl::lts_20240722::Status::~Status((Status *)&is_empty);
LAB_0029f1a2:
  absl::lts_20240722::Status::~Status((Status *)&entry);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteMap(JsonWriter& writer, const Msg<Traits>& msg,
                      Field<Traits> field) {
  writer.Write("{");
  writer.Push();

  size_t count = Traits::GetSize(field, msg);
  bool first = true;
  for (size_t i = 0; i < count; ++i) {
    absl::StatusOr<const Msg<Traits>*> entry =
        Traits::GetMessage(field, msg, i);
    RETURN_IF_ERROR(entry.status());
    const Desc<Traits>& type = Traits::GetDesc(**entry);

    auto is_empty = IsEmptyValue<Traits>(**entry, Traits::ValueField(type));
    RETURN_IF_ERROR(is_empty.status());
    if (*is_empty) {
      // Empty google.protobuf.Values are silently discarded.
      continue;
    }

    writer.WriteComma(first);
    writer.NewLine();
    RETURN_IF_ERROR(
        WriteMapKey<Traits>(writer, **entry, Traits::KeyField(type)));
    writer.Write(":");
    writer.Whitespace(" ");
    RETURN_IF_ERROR(
        WriteSingular<Traits>(writer, Traits::ValueField(type), **entry));
  }

  writer.Pop();
  if (!first) {
    writer.NewLine();
  }
  writer.Write("}");
  return absl::OkStatus();
}